

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osmesa_context.c
# Opt level: O0

OSMesaContext glfwGetOSMesaContext(GLFWwindow *handle)

{
  long in_RDI;
  _GLFWwindow *window;
  undefined8 local_8;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    local_8 = (OSMesaContext)0x0;
  }
  else if (*(int *)(in_RDI + 0x1f8) == 0) {
    _glfwInputError(0x1000a,(char *)0x0);
    local_8 = (OSMesaContext)0x0;
  }
  else {
    local_8 = *(OSMesaContext *)(in_RDI + 0x2a0);
  }
  return local_8;
}

Assistant:

GLFWAPI OSMesaContext glfwGetOSMesaContext(GLFWwindow* handle)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (window->context.client == GLFW_NO_API)
    {
        _glfwInputError(GLFW_NO_WINDOW_CONTEXT, NULL);
        return NULL;
    }

    return window->context.osmesa.handle;
}